

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
erase_range(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
            *this,int start_key,int end_key,bool end_key_inclusive)

{
  bool bVar1;
  uint pos;
  int iVar2;
  undefined7 in_register_00000009;
  int iVar3;
  int local_2c;
  
  local_2c = end_key;
  if ((int)CONCAT71(in_register_00000009,end_key_inclusive) == 0) {
    pos = lower_bound<int>(this,&local_2c);
  }
  else {
    pos = upper_bound<int>(this,&local_2c);
  }
  if (pos == 0) {
    iVar3 = 0;
  }
  else {
    iVar2 = 0x7fffffff;
    if (pos != this->data_capacity_) {
      iVar2 = this->key_slots_[(int)pos];
    }
    iVar3 = 0;
    while (0 < (int)pos) {
      pos = pos - 1;
      if (this->key_slots_[pos] < start_key) break;
      this->key_slots_[pos] = iVar2;
      bVar1 = check_exists(this,pos);
      iVar3 = iVar3 + (uint)bVar1;
      unset_bit(this,pos);
    }
    iVar2 = this->num_keys_ - iVar3;
    this->num_keys_ = iVar2;
    if ((double)iVar2 < this->contraction_threshold_) {
      resize(this,0.8,false,false,false);
      this->num_resizes_ = this->num_resizes_ + 1;
    }
  }
  return iVar3;
}

Assistant:

int erase_range(T start_key, T end_key, bool end_key_inclusive = false) {
    int pos;
    if (end_key_inclusive) {
      pos = upper_bound(end_key);
    } else {
      pos = lower_bound(end_key);
    }

    if (pos == 0) return 0;

    // Erase preceding positions until key value is below the start key
    int num_erased = 0;
    T next_key;
    if (pos == data_capacity_) {
      next_key = kEndSentinel_;
    } else {
      next_key = ALEX_DATA_NODE_KEY_AT(pos);
    }
    pos--;
    while (pos >= 0 &&
           key_greaterequal(ALEX_DATA_NODE_KEY_AT(pos), start_key)) {
      ALEX_DATA_NODE_KEY_AT(pos) = next_key;
      num_erased += check_exists(pos);
      unset_bit(pos);
      pos--;
    }

    num_keys_ -= num_erased;

    if (num_keys_ < contraction_threshold_) {
      resize(kMaxDensity_);  // contract
      num_resizes_++;
    }
    return num_erased;
  }